

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

MainFunc __thiscall capnp::compiler::CompilerMain::getConvertMain(CompilerMain *this)

{
  ProcessContext *context;
  StringPtr extendedDescription;
  StringPtr helpText;
  StringPtr helpText_00;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr argumentTitle;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr helpText_01;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  StringPtr briefDescription;
  StringPtr version;
  MainBuilder *pMVar1;
  Type *func;
  Type *func_00;
  Type *func_01;
  Type *func_02;
  Type *func_03;
  Type *func_04;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  MainFunc MVar2;
  undefined1 local_24a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:170:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:170:30)>
  local_248;
  Function<kj::MainBuilder::Validity_()> local_238;
  undefined1 local_222 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:169:41),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:169:41)>
  local_220;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_210;
  StringPtr local_200;
  undefined1 local_1ea [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:168:48),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:168:48)>
  local_1e8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_1d8;
  StringPtr local_1c8;
  undefined1 local_1b2 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:167:38),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:167:38)>
  local_1b0;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_1a0;
  StringPtr local_190;
  StringPtr local_180;
  undefined1 local_16a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:163:34),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:163:34)>
  local_168;
  Function<kj::MainBuilder::Validity_()> local_158;
  OptionName local_148 [2];
  StringPtr local_128;
  StringPtr local_118;
  undefined1 local_102 [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:158:48),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:158:48)>
  local_100;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_f0;
  OptionName local_e0 [2];
  StringPtr local_c0;
  undefined1 local_aa [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:155:34),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:155:34)>
  local_a8;
  Function<kj::MainBuilder::Validity_()> local_98;
  OptionName local_88 [3];
  StringPtr local_58;
  StringPtr local_48;
  StringPtr local_38;
  undefined1 local_28 [8];
  MainBuilder builder;
  CompilerMain *this_local;
  
  in_RSI->compileEagerness = 1;
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  context = in_RSI->context;
  kj::StringPtr::StringPtr(&local_38,"Cap\'n Proto version 2.0-dev");
  kj::StringPtr::StringPtr
            (&local_48,
             "Converts messages between formats. Reads a stream of messages from stdin in format <from> and writes them to stdout in format <to>. Valid formats are:\n    binary      standard binary format\n    packed      packed binary format (deflates zeroes)\n    flat        binary single segment, no segment table (rare)\n    flat-packed flat and packed\n    canonical   canonicalized binary single segment, no segment table\n    text        schema language struct literal format\n    json        JSON format\nWhen using \"text\" or \"json\" format, you must specify <schema-file> and <type> (but they are ignored and can be omitted for binary-to-binary conversions). <type> names names a struct type defined in <schema-file>, which is the root type of the message(s)."
            );
  kj::StringPtr::StringPtr(&local_58,(void *)0x0);
  version.content.size_ = local_38.content.size_;
  version.content.ptr = local_38.content.ptr;
  briefDescription.content.size_ = local_48.content.size_;
  briefDescription.content.ptr = local_48.content.ptr;
  extendedDescription.content.size_ = local_58.content.size_;
  extendedDescription.content.ptr = local_58.content.ptr;
  kj::MainBuilder::MainBuilder
            ((MainBuilder *)local_28,context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,(MainBuilder *)local_28);
  kj::MainBuilder::OptionName::OptionName(local_88,"short");
  local_88[1]._0_8_ = local_88;
  local_88[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_a8.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_2_>
                         ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:155:34),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:155:34)>
                           *)in_RSI,(_ *)(local_aa + 1),(CompilerMain *)local_aa,
                          (Type *)local_38.content.size_,(Type *)local_48.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_98,&local_a8);
  kj::StringPtr::StringPtr
            (&local_c0,
             "Write text or JSON output in short (non-pretty) format. Each message will be printed on one line, without using whitespace to improve readability."
            );
  names_01._M_len = (size_type)local_88[1].field_1;
  names_01._M_array = (iterator)local_88[1]._0_8_;
  helpText_01.content.size_ = local_c0.content.size_;
  helpText_01.content.ptr = local_c0.content.ptr;
  func = (Type *)&local_98;
  pMVar1 = kj::MainBuilder::addOption
                     ((MainBuilder *)local_28,names_01,
                      (Function<kj::MainBuilder::Validity_()> *)func,helpText_01);
  kj::MainBuilder::OptionName::OptionName(local_e0,"segment-size");
  local_e0[1]._0_8_ = local_e0;
  local_e0[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_100.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_4_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:158:48),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:158:48)>
                            *)in_RSI,(_ *)(local_102 + 1),(CompilerMain *)local_102,func,
                           (Type *)local_c0.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_f0,&local_100);
  kj::StringPtr::StringPtr(&local_118,"<n>");
  kj::StringPtr::StringPtr
            (&local_128,
             "For binary output, sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
            );
  names_00._M_len = (size_type)local_e0[1].field_1;
  names_00._M_array = (iterator)local_e0[1]._0_8_;
  argumentTitle.content.size_ = local_118.content.size_;
  argumentTitle.content.ptr = local_118.content.ptr;
  func_00 = (Type *)&local_f0;
  helpText.content.size_ = local_128.content.size_;
  helpText.content.ptr = local_128.content.ptr;
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     (pMVar1,names_00,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_00
                      ,argumentTitle,helpText);
  kj::MainBuilder::OptionName::OptionName(local_148,"quiet");
  local_148[1]._0_8_ = local_148;
  local_148[1].field_1 = (anon_union_8_2_b8f7b3a3_for_OptionName_1)0x1;
  local_168.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_6_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:163:34),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:163:34)>
                            *)in_RSI,(_ *)(local_16a + 1),(CompilerMain *)local_16a,func_00,
                           (Type *)local_118.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_158,&local_168);
  kj::StringPtr::StringPtr
            (&local_180,
             "Do not print warning messages about the input being in the wrong format.  Use this if you find the warnings are wrong (but also let us know so we can improve them)."
            );
  names._M_len = (size_type)local_148[1].field_1;
  names._M_array = (iterator)local_148[1]._0_8_;
  helpText_00.content.size_ = local_180.content.size_;
  helpText_00.content.ptr = local_180.content.ptr;
  func_01 = (Type *)&local_158;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names,(Function<kj::MainBuilder::Validity_()> *)func_01,helpText_00);
  kj::StringPtr::StringPtr(&local_190,"<from>:<to>");
  local_1b0.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_8_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:167:38),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:167:38)>
                            *)in_RSI,(_ *)(local_1b2 + 1),(CompilerMain *)local_1b2,func_01,
                           (Type *)local_180.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_1a0,&local_1b0);
  func_02 = (Type *)&local_1a0;
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,local_190,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_02);
  kj::StringPtr::StringPtr(&local_1c8,"<schema-file>");
  local_1e8.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_10_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:168:48),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:168:48)>
                            *)in_RSI,(_ *)(local_1ea + 1),(CompilerMain *)local_1ea,func_02,
                           (Type *)local_180.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_1d8,&local_1e8);
  func_03 = (Type *)&local_1d8;
  pMVar1 = kj::MainBuilder::expectOptionalArg
                     (pMVar1,local_1c8,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_03);
  kj::StringPtr::StringPtr(&local_200,"<type>");
  local_220.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_12_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:169:41),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:169:41)>
                            *)in_RSI,(_ *)(local_222 + 1),(CompilerMain *)local_222,func_03,
                           (Type *)local_180.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_210,&local_220);
  func_04 = (Type *)&local_210;
  pMVar1 = kj::MainBuilder::expectOptionalArg
                     (pMVar1,local_200,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func_04);
  local_248.t = (CompilerMain *)
                kj::_::
                boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_14_>
                          ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:170:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:170:30)>
                            *)in_RSI,(_ *)(local_24a + 1),(CompilerMain *)local_24a,func_04,
                           (Type *)local_180.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getConvertMain()::_lambda(auto:1&,(auto:2&&)___)_14_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_238,&local_248);
  kj::MainBuilder::callAfterParsing(pMVar1,&local_238);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_238);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_210);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_1d8);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_1a0);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_158);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(&local_f0);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_98);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder((MainBuilder *)local_28);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

kj::MainFunc getConvertMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    kj::MainBuilder builder(context, VERSION_STRING,
          "Converts messages between formats. Reads a stream of messages from stdin in format "
          "<from> and writes them to stdout in format <to>. Valid formats are:\n"
          "    binary      standard binary format\n"
          "    packed      packed binary format (deflates zeroes)\n"
          "    flat        binary single segment, no segment table (rare)\n"
          "    flat-packed flat and packed\n"
          "    canonical   canonicalized binary single segment, no segment table\n"
          "    text        schema language struct literal format\n"
          "    json        JSON format\n"
          "When using \"text\" or \"json\" format, you must specify <schema-file> and <type> "
          "(but they are ignored and can be omitted for binary-to-binary conversions). "
          "<type> names names a struct type defined in <schema-file>, which is the root type "
          "of the message(s).");
    addGlobalOptions(builder);
    builder.addOption({"short"}, KJ_BIND_METHOD(*this, printShort),
               "Write text or JSON output in short (non-pretty) format. Each message will "
               "be printed on one line, without using whitespace to improve readability.")
           .addOptionWithArg({"segment-size"}, KJ_BIND_METHOD(*this, setSegmentSize), "<n>",
               "For binary output, sets the preferred segment size on the MallocMessageBuilder to <n> "
               "words and turns off heuristic growth.  This flag is mainly useful "
               "for testing.  Without it, each message will be written as a single "
               "segment.")
           .addOption({"quiet"}, KJ_BIND_METHOD(*this, setQuiet),
               "Do not print warning messages about the input being in the wrong format.  "
               "Use this if you find the warnings are wrong (but also let us know so "
               "we can improve them).")
           .expectArg("<from>:<to>", KJ_BIND_METHOD(*this, setConversion))
           .expectOptionalArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectOptionalArg("<type>", KJ_BIND_METHOD(*this, setRootType))
           .callAfterParsing(KJ_BIND_METHOD(*this, convert));
    return builder.build();
  }